

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

void Wln_NtkStaticFanoutStart(Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Wln_Vec_t *pWVar5;
  undefined8 *__ptr;
  int *piVar6;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar7;
  ulong uVar8;
  uint uVar9;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar10;
  long lVar11;
  ulong uVar12;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar13;
  long lVar14;
  
  __ptr = (undefined8 *)malloc(0x10);
  Wln_NtkCreateRefs(p);
  Wln_NtkStartFanoutMap(p,&p->vFanout,&p->vRefs,1);
  piVar6 = (p->vRefs).pArray;
  *__ptr = *(undefined8 *)&p->vRefs;
  __ptr[1] = piVar6;
  (p->vRefs).nCap = 0;
  (p->vRefs).nSize = 0;
  (p->vRefs).pArray = (int *)0x0;
  iVar1 = (p->vTypes).nCap;
  lVar14 = (long)iVar1;
  if (0 < lVar14) {
    piVar6 = (p->vRefs).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(lVar14 * 4);
    }
    else {
      piVar6 = (int *)realloc(piVar6,lVar14 * 4);
    }
    (p->vRefs).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRefs).nCap = iVar1;
  }
  if (0 < iVar1) {
    memset((p->vRefs).pArray,0,lVar14 << 2);
  }
  (p->vRefs).nSize = iVar1;
  uVar9 = (p->vTypes).nSize;
  if (1 < (int)uVar9) {
    pWVar5 = p->vFanins;
    paVar7 = &pWVar5[1].field_2;
    lVar14 = 1;
    do {
      uVar12 = (ulong)(uint)pWVar5[lVar14].nSize;
      if (0 < pWVar5[lVar14].nSize) {
        lVar11 = 0;
        paVar10 = paVar7;
        do {
          paVar13 = paVar10;
          if (2 < (int)uVar12) {
            paVar13 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)
                      (pWVar5[lVar14].field_2.pArray[0] + lVar11);
          }
          uVar9 = paVar13->Array[0];
          uVar12 = (ulong)uVar9;
          if (uVar12 != 0) {
            if (((int)uVar9 < 0) || ((p->vRefs).nSize <= (int)uVar9)) {
LAB_00385b6b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            piVar6 = (p->vRefs).pArray;
            iVar1 = piVar6[uVar12];
            piVar6[uVar12] = iVar1 + 1;
            iVar2 = (p->vFanout).nSize;
            if (iVar2 <= (int)uVar9) goto LAB_00385b8a;
            piVar6 = (p->vFanout).pArray;
            iVar3 = piVar6[uVar12];
            if (((long)iVar3 < 0) || (iVar2 <= iVar3)) goto LAB_00385b6b;
            piVar6[(long)iVar3 + (long)iVar1] = (int)lVar14;
          }
          lVar11 = lVar11 + 1;
          uVar12 = (ulong)pWVar5[lVar14].nSize;
          paVar10 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)((long)paVar10 + 4);
        } while (lVar11 < (long)uVar12);
      }
      lVar14 = lVar14 + 1;
      uVar9 = (p->vTypes).nSize;
      paVar7 = paVar7 + 2;
    } while (lVar14 < (int)uVar9);
  }
  if (1 < (int)uVar9) {
    uVar4 = (p->vRefs).nSize;
    uVar12 = 1;
    if (1 < (int)uVar4) {
      uVar12 = (ulong)uVar4;
    }
    uVar8 = 1;
    do {
      if ((uVar12 == uVar8) || ((long)*(int *)((long)__ptr + 4) <= (long)uVar8)) {
LAB_00385b8a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vRefs).pArray[uVar8] != *(int *)(__ptr[1] + uVar8 * 4)) {
        __assert_fail("Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                      ,0x1a4,"void Wln_NtkStaticFanoutStart(Wln_Ntk_t *)");
      }
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  if ((void *)__ptr[1] != (void *)0x0) {
    free((void *)__ptr[1]);
    __ptr[1] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Wln_NtkStaticFanoutStart( Wln_Ntk_t * p )
{
    int k, iObj, iFanin;
    Vec_Int_t * vRefsCopy = Vec_IntAlloc(0);
    Wln_NtkCreateRefs( p );
    Wln_NtkStartFanoutMap( p, &p->vFanout, &p->vRefs, 1 );
    ABC_SWAP( Vec_Int_t, *vRefsCopy, p->vRefs );
    // add fanouts
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjSetFanout( p, iFanin, Wln_ObjRefsInc(p, iFanin), iObj );
    // double-check the current number of fanouts added
    Wln_NtkForEachObj( p, iObj )
        assert( Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj) );
    Vec_IntFree( vRefsCopy );
}